

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<std::pair<int,_long>,_60> * __thiscall
TPZManVector<std::pair<int,_long>,_60>::operator=
          (TPZManVector<std::pair<int,_long>,_60> *this,TPZManVector<std::pair<int,_long>,_60> *copy
          )

{
  ulong uVar1;
  pair<int,_long> *ppVar2;
  pair<int,_long> *ppVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (this == copy) {
    return this;
  }
  uVar1 = (copy->super_TPZVec<std::pair<int,_long>_>).fNElements;
  lVar5 = (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc;
  if ((lVar5 < (long)uVar1) &&
     (ppVar2 = (this->super_TPZVec<std::pair<int,_long>_>).fStore,
     ppVar2 != this->fExtAlloc && ppVar2 != (pair<int,_long> *)0x0)) {
    operator_delete__(ppVar2);
    (this->super_TPZVec<std::pair<int,_long>_>).fStore = (pair<int,_long> *)0x0;
    (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0;
    lVar5 = 0;
  }
  if ((long)uVar1 < 0x3d) {
    ppVar3 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
    ppVar2 = this->fExtAlloc;
    if (ppVar3 != (pair<int,_long> *)0x0 && ppVar3 != ppVar2) {
      operator_delete__(ppVar3);
    }
    (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0;
    (this->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar2;
  }
  else {
    if ((long)uVar1 <= lVar5) {
      (this->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar1;
      ppVar2 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
      goto LAB_00c2310e;
    }
    ppVar2 = (pair<int,_long> *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 * 0x10);
    ppVar3 = ppVar2;
    do {
      ppVar3->first = 0;
      ppVar3->second = 0;
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2 + uVar1);
    (this->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar2;
    (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = uVar1;
  }
  (this->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar1;
LAB_00c2310e:
  ppVar3 = (copy->super_TPZVec<std::pair<int,_long>_>).fStore;
  uVar4 = 0;
  if (0 < (long)uVar1) {
    uVar4 = uVar1;
  }
  lVar5 = 8;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
    *(undefined4 *)((long)ppVar2 + lVar5 + -8) = *(undefined4 *)((long)ppVar3 + lVar5 + -8);
    *(undefined8 *)((long)&ppVar2->first + lVar5) = *(undefined8 *)((long)&ppVar3->first + lVar5);
    lVar5 = lVar5 + 0x10;
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}